

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_stream.hpp
# Opt level: O3

basic_binary_istream<fail_flag_serialization_policy> *
detail::operator>>(istream_mixin<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
                   *stream,map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *value)

{
  byte *pbVar1;
  span<const_std::byte> buffer;
  pair<unsigned_long,_bool> pVar2;
  
  if ((stream->
      super_stream_mixin_base<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
      ).super_fail_flag_serialization_policy.overflow == false) {
    pbVar1 = *(byte **)(stream + -0x10);
    if (*(long *)(stream + -8) - (long)pbVar1 < 0) {
      __assert_fail("diff >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/src/include/span.hpp"
                    ,0x22,"size_t span<const std::byte>::size() const [T = const std::byte]");
    }
    buffer.end_ = pbVar1 + (*(long *)(stream + -8) - (long)pbVar1);
    buffer.begin_ = pbVar1;
    pVar2 = try_get_deserialized_size<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
                      (buffer);
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      (stream->
      super_stream_mixin_base<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
      ).super_fail_flag_serialization_policy.overflow = true;
    }
    else {
      do_deserialize<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
                (value,(basic_binary_istream<fail_flag_serialization_policy> *)(stream + -0x10));
    }
  }
  return (basic_binary_istream<fail_flag_serialization_policy> *)(stream + -0x10);
}

Assistant:

StreamDerived& operator>>(istream_mixin<StreamDerived, SpanBase, fail_flag_serialization_policy>& stream, T& value) {
        if (stream.overflow) return stream.base();

        auto const [_, success] = try_get_deserialized_size<T>(stream.span());
        if (!success) {
            stream.overflow = true;
            return stream.base();
        }
        deserialize(value, stream.span());
        return stream.base();
    }